

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.c
# Opt level: O1

size_t ZSTD_compressSuperBlock
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,uint lastBlock
                 )

{
  seqDef *psVar1;
  ushort uVar2;
  bool bVar3;
  symbolEncodingType_e sVar4;
  bool bVar5;
  bool bVar6;
  uint *workspace;
  void *pvVar7;
  int iVar8;
  size_t err_code_1;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  byte *pbVar14;
  byte *pbVar15;
  long lVar16;
  size_t __n;
  size_t sVar17;
  byte *pbVar18;
  U16 *pUVar19;
  uint uVar20;
  ZSTD_compressedBlockState_t *pZVar21;
  uint uVar22;
  undefined4 in_register_0000008c;
  U32 *pUVar23;
  size_t err_code;
  byte *pbVar24;
  ulong uVar25;
  ulong uVar26;
  BYTE *source;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  size_t in_stack_fffffffffffffd88;
  byte *local_258;
  undefined8 local_250;
  U32 local_248 [2];
  byte *local_240;
  seqDef *local_238;
  byte *local_230;
  byte *local_228;
  byte *local_220;
  long local_218;
  seqDef *sstart;
  ZSTD_compressedBlockState_t *local_208;
  ZSTD_CCtx *local_200;
  BYTE *local_1f8;
  BYTE *local_1f0;
  BYTE *local_1e8;
  byte *local_1e0;
  uint *countWksp;
  ZSTD_compressedBlockState_t *local_1d0;
  byte *local_1c8;
  undefined8 local_1c0;
  FSE_CTable *local_1b8;
  FSE_CTable *local_1b0;
  ZSTD_fseCTables_t *local_1a8;
  seqDef *local_1a0;
  byte *local_198;
  void *local_190;
  ulong local_188;
  seqDef *local_180;
  byte *local_178;
  BYTE *local_170;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  
  local_1c0 = CONCAT44(in_register_0000008c,lastBlock);
  local_258 = (byte *)ZSTD_buildBlockEntropyStats
                                (&zc->seqStore,&((zc->blockState).prevCBlock)->entropy,
                                 &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                                 &entropyMetadata,zc->entropyWorkspace,0x19d8);
  if (local_258 < (byte *)0xffffffffffffff89) {
    local_1d0 = (zc->blockState).prevCBlock;
    local_208 = (zc->blockState).nextCBlock;
    local_188 = (ulong)(uint)zc->bmi2;
    countWksp = zc->entropyWorkspace;
    local_238 = (zc->seqStore).sequencesStart;
    local_1a0 = (zc->seqStore).sequences;
    source = (zc->seqStore).litStart;
    local_170 = (zc->seqStore).lit;
    local_198 = (byte *)(srcSize + (long)src);
    local_218 = dstCapacity + (long)dst;
    local_1e8 = (zc->seqStore).llCode;
    local_1f0 = (zc->seqStore).mlCode;
    local_1f8 = (zc->seqStore).ofCode;
    local_178 = (byte *)(zc->appliedParams).targetCBlockSize;
    bVar27 = entropyMetadata.hufMetadata.hType == set_compressed;
    local_180 = local_1a0 + -1;
    local_1a8 = &(local_208->entropy).fse;
    local_1b0 = (local_208->entropy).fse.litlengthCTable;
    local_1b8 = (local_208->entropy).fse.matchlengthCTable;
    bVar6 = true;
    uVar25 = 0;
    pbVar24 = (byte *)0x0;
    local_258 = (byte *)dst;
    sstart = local_238;
    local_200 = zc;
    local_1c8 = (byte *)src;
    local_190 = dst;
    do {
      if (local_238 == local_1a0) {
        bVar28 = true;
      }
      else {
        psVar1 = sstart + uVar25;
        bVar28 = psVar1 == local_180;
        uVar2 = psVar1->litLength;
        uVar20 = (uint)uVar2;
        if ((zc->seqStore).longLengthPos ==
            (U32)((ulong)((long)psVar1 - (long)(zc->seqStore).sequencesStart) >> 3)) {
          uVar20 = uVar2 + 0xffff;
          if ((zc->seqStore).longLengthType != ZSTD_llt_literalLength) {
            uVar20 = (uint)uVar2;
          }
        }
        pbVar24 = pbVar24 + uVar20;
        uVar25 = uVar25 + 1;
      }
      pbVar14 = local_170 + -(long)source;
      if (bVar28 == false) {
        pbVar14 = pbVar24;
      }
      local_250 = CONCAT44(local_250._4_4_,0xff);
      pbVar15 = pbVar14;
      if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
        sVar17 = HIST_count_wksp(countWksp,(uint *)&local_250,source,(size_t)pbVar14,countWksp,
                                 0x19d8);
        if (sVar17 < 0xffffffffffffff89) {
          sVar9 = HUF_estimateCompressedSize((HUF_CElt *)local_208,countWksp,(uint)local_250);
          sVar17 = entropyMetadata.hufMetadata.hufDesSize;
          if (!bVar27) {
            sVar17 = 0;
          }
          pbVar15 = (byte *)(sVar9 + sVar17 + 3);
        }
      }
      else if (entropyMetadata.hufMetadata.hType != set_basic) {
        if (entropyMetadata.hufMetadata.hType == set_rle) {
          pbVar15 = &DAT_00000001;
        }
        else {
          pbVar15 = (byte *)0x0;
        }
      }
      workspace = countWksp;
      local_230 = pbVar14;
      if (uVar25 == 0) {
        lVar12 = 3;
      }
      else {
        sVar9 = ZSTD_estimateSubBlockSize_symbolType
                          (entropyMetadata.fseMetadata.ofType,local_1f8,0x1f,uVar25,
                           local_1a8->offcodeCTable,(U32 *)0x0,OF_defaultNorm,5,0x1c,countWksp,
                           in_stack_fffffffffffffd88);
        sVar10 = ZSTD_estimateSubBlockSize_symbolType
                           (entropyMetadata.fseMetadata.llType,local_1e8,0x23,uVar25,local_1b0,
                            LL_bits,LL_defaultNorm,6,0x23,workspace,in_stack_fffffffffffffd88);
        sVar11 = ZSTD_estimateSubBlockSize_symbolType
                           (entropyMetadata.fseMetadata.mlType,local_1f0,0x34,uVar25,local_1b8,
                            ML_bits,ML_defaultNorm,6,0x34,workspace,in_stack_fffffffffffffd88);
        sVar17 = 0;
        if (bVar6) {
          sVar17 = entropyMetadata.fseMetadata.fseTablesSize;
        }
        lVar12 = sVar17 + sVar9 + sVar10 + sVar11 + 3;
        zc = local_200;
      }
      pbVar14 = local_230;
      bVar29 = true;
      pbVar24 = local_230;
      pbVar18 = local_1e0;
      if ((~bVar28 & pbVar15 + lVar12 + 3 <= local_178) == 0) {
        if ((long)uVar25 < 1) {
          lVar12 = 0;
        }
        else {
          uVar13 = (long)sstart - (long)(zc->seqStore).sequencesStart;
          lVar16 = uVar25 * 8;
          pUVar19 = &sstart->matchLength;
          lVar12 = 0;
          do {
            uVar20 = *pUVar19 + 3;
            if (((zc->seqStore).longLengthPos == (U32)(uVar13 >> 3)) &&
               ((zc->seqStore).longLengthType == ZSTD_llt_matchLength)) {
              uVar20 = *pUVar19 + 0x10002;
            }
            lVar12 = lVar12 + (ulong)uVar20;
            uVar13 = uVar13 + 8;
            lVar16 = lVar16 + -8;
            pUVar19 = pUVar19 + 4;
          } while (0 < lVar16);
        }
        bVar29 = (int)local_1c0 != 0;
        sVar17 = (local_218 - (long)local_258) - 3;
        lVar16 = 0;
        if (bVar27) {
          lVar16 = 200;
        }
        pbVar24 = local_258 + 3;
        sVar4 = entropyMetadata.hufMetadata.hType;
        if (!bVar27) {
          sVar4 = set_repeat;
        }
        lVar16 = (ulong)((byte *)(0x4000 - lVar16) <= local_230) -
                 (ulong)(local_230 < (byte *)(0x400 - lVar16));
        local_240 = pbVar24;
        if (local_230 == (byte *)0x0) {
LAB_00634ee6:
          pbVar14 = (byte *)ZSTD_noCompressLiterals(pbVar24,sVar17,source,(size_t)local_230);
LAB_00634f0e:
          uVar13 = CONCAT71((int7)((ulong)pbVar24 >> 8),1);
        }
        else {
          if (entropyMetadata.hufMetadata.hType == set_rle) {
            pbVar14 = (byte *)ZSTD_compressRleLiteralsBlock(pbVar24,sVar17,source,(size_t)local_230)
            ;
            goto LAB_00634f0e;
          }
          if (entropyMetadata.hufMetadata.hType == set_basic) goto LAB_00634ee6;
          local_220 = local_258 + lVar16 + 7;
          if (entropyMetadata.hufMetadata.hType == set_compressed && bVar27) {
            memcpy(local_220,entropyMetadata.hufMetadata.hufDesBuffer,
                   entropyMetadata.hufMetadata.hufDesSize);
            local_228 = (byte *)entropyMetadata.hufMetadata.hufDesSize;
            local_220 = local_220 + entropyMetadata.hufMetadata.hufDesSize;
          }
          else {
            local_228 = (byte *)0x0;
          }
          uVar26 = lVar16 + 4;
          pZVar21 = local_208;
          if (uVar26 == 3) {
            pbVar24 = (byte *)HUF_compress1X_usingCTable
                                        (local_220,local_218 - (long)local_220,source,
                                         (size_t)pbVar14,(HUF_CElt *)local_208);
          }
          else {
            pbVar24 = (byte *)HUF_compress4X_usingCTable
                                        (local_220,local_218 - (long)local_220,source,
                                         (size_t)pbVar14,(HUF_CElt *)local_208);
          }
          pbVar15 = local_228 + (long)pbVar24;
          if (pbVar24 + -1 < (byte *)0xffffffffffffff88) {
            if (((!bVar27) && (local_230 <= pbVar15)) ||
               (bVar3 = true,
               uVar26 < ((ulong)((byte *)0x3ff < pbVar15) - (ulong)(pbVar15 < (byte *)0x4000)) + 4))
            {
              local_228 = pbVar24;
              pbVar14 = (byte *)ZSTD_noCompressLiterals(local_240,sVar17,source,(size_t)local_230);
              bVar3 = false;
              pbVar24 = local_228;
            }
          }
          else {
            bVar3 = false;
            pbVar14 = (byte *)0x0;
          }
          uVar13 = CONCAT71((int7)((ulong)pZVar21 >> 8),1);
          if (bVar3) {
            uVar20 = (uint)pbVar15;
            iVar8 = (int)local_230;
            if (uVar26 == 5) {
              *(symbolEncodingType_e *)(local_258 + 3) =
                   uVar20 * 0x400000 + sVar4 + iVar8 * 0x10 + 0xc;
              local_258[7] = (byte)(uVar20 >> 10);
            }
            else if (uVar26 == 4) {
              *(symbolEncodingType_e *)local_240 = uVar20 * 0x40000 + sVar4 + iVar8 * 0x10 + 8;
            }
            else {
              iVar8 = iVar8 * 0x10 + (uint)(uVar26 != 3) * 4 + sVar4 + uVar20 * 0x4000;
              *(short *)(local_258 + 3) = (short)iVar8;
              local_258[5] = (byte)((uint)iVar8 >> 0x10);
            }
            pbVar14 = local_220 + (long)pbVar24 + -(long)local_240;
            uVar13 = 0;
          }
        }
        bVar3 = false;
        pbVar24 = local_240;
        if (pbVar14 < (byte *)0xffffffffffffff89) {
          if (pbVar14 == (byte *)0x0) {
            bVar5 = false;
            pbVar14 = (byte *)0x0;
          }
          else {
            bVar5 = true;
            pbVar24 = local_240 + (long)pbVar14;
          }
        }
        else {
          bVar5 = false;
        }
        if (bVar5) {
          uVar20 = (local_200->appliedParams).cParams.windowLog;
          pbVar15 = (byte *)0xffffffffffffffba;
          bVar3 = false;
          if (3 < local_218 - (long)pbVar24) {
            if (uVar25 < 0x7f) {
              pbVar15 = pbVar24 + 1;
              *pbVar24 = (byte)uVar25;
            }
            else if (uVar25 < 0x7f00) {
              *pbVar24 = (byte)(uVar25 >> 8) | 0x80;
              pbVar24[1] = (byte)uVar25;
              pbVar15 = pbVar24 + 2;
            }
            else {
              *pbVar24 = 0xff;
              *(short *)(pbVar24 + 1) = (short)uVar25 + -0x7f00;
              pbVar15 = pbVar24 + 3;
            }
            if (uVar25 == 0) {
              pbVar15 = pbVar15 + -(long)pbVar24;
            }
            else {
              local_220 = (byte *)CONCAT44(local_220._4_4_,(int)uVar13);
              pbVar18 = pbVar15 + 1;
              local_240 = pbVar24;
              local_228 = pbVar15;
              if (bVar6) {
                *pbVar15 = (char)(entropyMetadata.fseMetadata.ofType << 4) +
                           (char)(entropyMetadata.fseMetadata.llType << 6) +
                           (char)entropyMetadata.fseMetadata.mlType * '\x04';
                memcpy(pbVar18,entropyMetadata.fseMetadata.fseTablesBuffer,
                       entropyMetadata.fseMetadata.fseTablesSize);
                pbVar18 = pbVar18 + entropyMetadata.fseMetadata.fseTablesSize;
              }
              else {
                *pbVar15 = 0xfc;
              }
              pbVar15 = (byte *)ZSTD_encodeSequences
                                          (pbVar18,local_218 - (long)pbVar18,local_1b8,local_1f0,
                                           local_1a8->offcodeCTable,local_1f8,local_1b0,local_1e8,
                                           sstart,uVar25,(uint)(0x39 < uVar20),(int)local_188);
              bVar3 = false;
              if (pbVar15 < (byte *)0xffffffffffffff89) {
                pbVar18 = pbVar18 + (long)pbVar15;
                if (((bVar6) && (entropyMetadata.fseMetadata.lastCountSize != 0)) &&
                   (pbVar15 + entropyMetadata.fseMetadata.lastCountSize < (byte *)0x4)) {
                  bVar5 = false;
                  pbVar15 = (byte *)0x0;
                }
                else {
                  bVar5 = true;
                }
              }
              else {
                bVar5 = false;
              }
              uVar13 = (ulong)local_220 & 0xffffffff;
              pbVar24 = local_240;
              if (bVar5) {
                pbVar15 = pbVar18 + -(long)local_240;
                bVar3 = 3 < (long)pbVar18 - (long)local_228;
                if ((long)pbVar18 - (long)local_228 < 4) {
                  pbVar15 = (byte *)0x0;
                }
              }
            }
          }
          if (pbVar15 < (byte *)0xffffffffffffff89) {
            if (pbVar15 == (byte *)0x0) {
              bVar5 = false;
              pbVar14 = (byte *)0x0;
            }
            else {
              pbVar24 = pbVar24 + (long)pbVar15;
              bVar5 = true;
            }
          }
          else {
            bVar5 = false;
            pbVar14 = pbVar15;
          }
          if (bVar5) {
            pbVar14 = pbVar24 + -(long)local_258;
            iVar8 = ((byte)(bVar29 & bVar28) | 0xffffffec) + (int)pbVar14 * 8;
            *(short *)local_258 = (short)iVar8;
            local_258[2] = (byte)((uint)iVar8 >> 0x10);
          }
        }
        bVar29 = pbVar14 < (byte *)0xffffffffffffff89;
        zc = local_200;
        pbVar24 = local_230;
        pbVar18 = pbVar14;
        if (bVar29) {
          if ((pbVar14 != (byte *)0x0) && (pbVar14 < local_230 + lVar12)) {
            local_1c8 = local_1c8 + (long)(local_230 + lVar12);
            source = source + (long)local_230;
            local_258 = local_258 + (long)pbVar14;
            sstart = sstart + uVar25;
            local_1e8 = local_1e8 + uVar25;
            local_1f0 = local_1f0 + uVar25;
            local_1f8 = local_1f8 + uVar25;
            if ((char)uVar13 == '\0') {
              bVar27 = false;
            }
            if (bVar3) {
              bVar6 = false;
            }
            uVar25 = 0;
            pbVar24 = (byte *)0x0;
          }
          bVar29 = true;
          pbVar18 = local_1e0;
        }
      }
      local_1e0 = pbVar18;
      if (!bVar29) {
        return (size_t)local_1e0;
      }
    } while (bVar28 == false);
    if (bVar27) {
      memcpy(local_208,local_1d0,0x404);
    }
    pvVar7 = local_190;
    pbVar24 = local_1e0;
    psVar1 = sstart;
    if ((bVar6) &&
       (((entropyMetadata.fseMetadata.llType - set_rle < 2 ||
         (entropyMetadata.fseMetadata.mlType - set_rle < 2)) ||
        (0xfffffffd < entropyMetadata.fseMetadata.ofType - set_repeat)))) {
      local_258 = (byte *)0x0;
    }
    else {
      if (local_1c8 < local_198) {
        __n = (long)local_198 - (long)local_1c8;
        pbVar14 = (byte *)0xffffffffffffffba;
        if ((byte *)(__n + 3) <= (byte *)(local_218 - (long)local_258)) {
          iVar8 = (int)local_1c0 + (int)__n * 8;
          *(short *)local_258 = (short)iVar8;
          local_258[2] = (byte)((uint)iVar8 >> 0x10);
          memcpy(local_258 + 3,local_1c8,__n);
          pbVar14 = (byte *)(__n + 3);
        }
        pbVar15 = pbVar14;
        if ((pbVar14 < (byte *)0xffffffffffffff89) &&
           (local_258 = local_258 + (long)pbVar14, pbVar15 = pbVar24, psVar1 < local_1a0)) {
          local_248[0] = local_1d0->rep[2];
          local_250 = *(ulong *)local_1d0->rep;
          if (local_238 < psVar1) {
            uVar25 = (long)local_238 - (long)(zc->seqStore).sequencesStart;
            do {
              uVar2 = local_238->litLength;
              uVar20 = (uint)uVar2;
              if (((zc->seqStore).longLengthPos == (U32)(uVar25 >> 3)) &&
                 (uVar20 = uVar2 + 0xffff, (zc->seqStore).longLengthType != ZSTD_llt_literalLength))
              {
                uVar20 = (uint)uVar2;
              }
              uVar22 = local_238->offset - 1;
              pUVar23 = (U32 *)((long)&local_250 + 4);
              if (uVar22 < 3) {
                uVar22 = uVar22 + (uVar20 == 0);
                if (uVar22 == 0) {
                  uVar13 = local_250 >> 0x20;
                  pUVar23 = local_248;
                }
                else {
                  if (uVar22 == 3) {
                    uVar20 = (uint)local_250 - 1;
                  }
                  else {
                    uVar20 = local_248[(ulong)uVar22 - 2];
                  }
                  if (uVar22 == 1) {
                    pUVar23 = local_248;
                  }
                  uVar13 = local_250 & 0xffffffff;
                  local_250 = (ulong)uVar20;
                }
              }
              else {
                uVar13 = local_250 & 0xffffffff;
                local_250 = (ulong)(local_238->offset - 3);
              }
              local_250 = local_250 & 0xffffffff | uVar13 << 0x20;
              local_248[0] = *pUVar23;
              local_238 = local_238 + 1;
              uVar25 = uVar25 + 8;
            } while (local_238 < psVar1);
          }
          local_208->rep[2] = local_248[0];
          *(ulong *)local_208->rep = local_250;
        }
        if ((byte *)0xffffffffffffff88 < pbVar14) {
          return (size_t)pbVar15;
        }
      }
      local_258 = local_258 + -(long)pvVar7;
    }
  }
  return (size_t)local_258;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               void const* src, size_t srcSize,
                               unsigned lastBlock) {
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */), "");

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            zc->blockState.prevCBlock,
            zc->blockState.nextCBlock,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            src, srcSize,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}